

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Own<const_kj::FsNode,_std::nullptr_t> __thiscall
kj::anon_unknown_9::DiskReadableFile::cloneFsNode(DiskReadableFile *this)

{
  int in_ECX;
  void *in_RDX;
  FsNode *extraout_RDX;
  long in_RSI;
  void *in_R8;
  Own<const_kj::FsNode,_std::nullptr_t> OVar1;
  DiskHandle local_2c;
  DiskReadableFile *this_local;
  
  this_local = this;
  DiskHandle::clone(&local_2c,(__fn *)(in_RSI + 8),in_RDX,in_ECX,in_R8);
  heap<kj::(anonymous_namespace)::DiskReadableFile,kj::OwnFd>
            ((kj *)&stack0xffffffffffffffd8,&local_2c.fd);
  Own<kj::FsNode_const,decltype(nullptr)>::Own<kj::(anonymous_namespace)::DiskReadableFile,void>
            ((Own<kj::FsNode_const,decltype(nullptr)> *)this,
             (Own<kj::(anonymous_namespace)::DiskReadableFile,_std::nullptr_t> *)
             &stack0xffffffffffffffd8);
  Own<kj::(anonymous_namespace)::DiskReadableFile,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::DiskReadableFile,_std::nullptr_t> *)
             &stack0xffffffffffffffd8);
  OwnFd::~OwnFd(&local_2c.fd);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

size_t read(uint64_t offset, ArrayPtr<byte> buffer) const override {
    return DiskHandle::read(offset, buffer);
  }